

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnginput.cc
# Opt level: O1

void __thiscall PngInput::readHeader(PngInput *this)

{
  iccProfileDescriptor *piVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  LodePNGColorMode *dest;
  LodePNGColorMode *source;
  undefined1 auVar2 [16];
  istream *piVar3;
  FormatDescriptor *this_01;
  char *__s;
  char *pcVar4;
  undefined1 uVar5;
  uint uVar6;
  int iVar7;
  uchar *puVar8;
  different_format *this_02;
  runtime_error *this_03;
  uint32_t channelBitLength;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in;
  khr_df_model_e m;
  uint32_t channelCount;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  uint32_t h;
  uint32_t w;
  ImageInputFormatType formatType;
  uint uStack_e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  uint8_t filesig [8];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  pointer local_78;
  pointer local_68;
  pointer local_60;
  pointer local_50;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t local_40;
  Origin local_3c [4];
  
  std::istream::read((char *)(this->super_ImageInput).isp,(long)filesig);
  piVar3 = (this->super_ImageInput).isp;
  if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
    ImageInput::throwOnReadFailure(&this->super_ImageInput);
  }
  if (filesig != (uint8_t  [8])0xa1a0a0d474e5089) {
    this_02 = (different_format *)__cxa_allocate_exception(0x10);
    ImageInput::different_format::different_format(this_02);
    __cxa_throw(this_02,&ImageInput::different_format::typeinfo,std::runtime_error::~runtime_error);
  }
  channelCount = 0;
  std::istream::seekg((long)(this->super_ImageInput).isp,_S_beg);
  slurp(this);
  in = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
        )(this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
  uVar6 = lodepng_decode_chunks
                    (&this->pIdat,&this->idatsize,&w,&h,&(this->state).super_LodePNGState,
                     (uchar *)in.values_,
                     (long)(this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)in);
  if (uVar6 != 0) {
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    _formatType = lodepng_error_text(uVar6);
    fmt_00.size_ = 0xc;
    fmt_00.data_ = (char *)0x1c;
    args_00.field_1.values_ = in.values_;
    args_00.desc_ = (unsigned_long_long)&formatType;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_b8,(v10 *)"PNG decode chunks error: {}.",fmt_00,args_00);
    std::runtime_error::runtime_error(this_03,(string *)local_b8);
    __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dest = &(this->state).super_LodePNGState.info_raw;
  source = &(this->state).super_LodePNGState.info_png.color;
  lodepng_color_mode_copy(dest,source);
  channelBitLength = (this->state).super_LodePNGState.info_png.color.bitdepth;
  m = KHR_DF_MODEL_RGBSDA;
  switch((this->state).super_LodePNGState.info_png.color.colortype) {
  case LCT_GREY:
    if ((this->state).super_LodePNGState.info_png.color.key_defined == 0) {
      channelCount = 1;
      m = KHR_DF_MODEL_YUVSDA;
      break;
    }
    dest->colortype = LCT_GREY_ALPHA;
  case LCT_GREY_ALPHA:
    m = KHR_DF_MODEL_YUVSDA;
    channelCount = 2;
    break;
  case LCT_RGB:
    if ((this->state).super_LodePNGState.info_png.color.key_defined == 0) {
      channelCount = 3;
      break;
    }
    dest->colortype = LCT_RGBA;
  case LCT_RGBA:
    channelCount = 4;
    break;
  case LCT_PALETTE:
    puVar8 = lodepng_chunk_find_const
                       ((uchar *)((this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 0x21),
                        (uchar *)((this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + -1),"tRNS");
    bVar9 = puVar8 != (uchar *)0x0;
    local_a8._M_allocated_capacity = (size_type)"R8G8B8A8";
    if (!bVar9) {
      local_a8._M_allocated_capacity = (size_type)"R8G8B8";
    }
    (this->state).super_LodePNGState.info_raw.colortype = (uint)bVar9 * 4 + LCT_RGB;
    local_b8._0_8_ = CONCAT44(0,(this->state).super_LodePNGState.info_png.color.bitdepth);
    if ((ulong)local_b8._0_8_ < 8) {
      channelBitLength = 8;
    }
    fmt.size_ = 0xc2;
    fmt.data_ = (char *)0x25;
    args.field_1.values_ = in.values_;
    args.desc_ = (unsigned_long_long)local_b8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&formatType,(v10 *)"Expanding {}-bit paletted image to {}",fmt,args);
    ImageInput::fwarning(&this->super_ImageInput,(string *)&formatType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_formatType != &local_d8) {
      operator_delete(_formatType,local_d8._M_allocated_capacity + 1);
    }
    channelCount = bVar9 + 3;
    m = KHR_DF_MODEL_RGBSDA;
  }
  switch(source->colortype) {
  case LCT_GREY:
    _formatType = (pointer)((ulong)uStack_e4 << 0x20);
    break;
  case LCT_RGB:
    formatType = 2;
    break;
  case LCT_PALETTE:
  case LCT_RGBA:
    formatType = 3;
    break;
  case LCT_GREY_ALPHA:
    formatType = 1;
  }
  FormatDescriptor::FormatDescriptor
            ((FormatDescriptor *)local_b8,channelCount,channelBitLength,0,
             KHR_DF_TRANSFER_UNSPECIFIED,KHR_DF_PRIMARIES_BT709,m,KHR_DF_FLAG_ALPHA_STRAIGHT);
  local_48 = w;
  local_44 = h;
  local_40 = 1;
  local_3c[0].x = '\0';
  local_3c[0].y = '\0';
  local_3c[0].z = '\0';
  std::vector<ImageInput::imageInfo,std::allocator<ImageInput::imageInfo>>::
  emplace_back<ImageSpec,ImageInputFormatType&>
            ((vector<ImageInput::imageInfo,std::allocator<ImageInput::imageInfo>> *)
             &(this->super_ImageInput).images,(ImageSpec *)local_b8,&formatType);
  if (local_60 != (pointer)0x0) {
    operator_delete(local_60,(long)local_50 - (long)local_60);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  this_01 = *(FormatDescriptor **)&(this->super_ImageInput).images;
  if ((this->state).super_LodePNGState.info_png.iccp_defined == 0) {
    if ((this->state).super_LodePNGState.info_png.srgb_defined == 0) {
      uVar6 = (this->state).super_LodePNGState.info_png.gama_defined;
      FormatDescriptor::setTransfer(this_01,KHR_DF_TRANSFER_UNSPECIFIED);
      if (uVar6 != 0) {
        (this_01->extended).oeGamma =
             (float)(this->state).super_LodePNGState.info_png.gama_gamma / 100000.0;
      }
    }
    else {
      FormatDescriptor::setTransfer(this_01,KHR_DF_TRANSFER_SCRGB);
      (this_01->basic).field_0x1 = 1;
    }
  }
  else {
    (this_01->basic).field_0x1 = 0;
    FormatDescriptor::setTransfer(this_01,KHR_DF_TRANSFER_UNSPECIFIED);
    __s = (this->state).super_LodePNGState.info_png.iccp_name;
    piVar1 = &(this_01->extended).iccProfile;
    pcVar4 = (char *)(this_01->extended).iccProfile.name._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)piVar1,0,pcVar4,(ulong)__s);
    this_00 = &(this_01->extended).iccProfile.profile;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_00,(ulong)(this->state).super_LodePNGState.info_png.iccp_profile_size);
    puVar8 = (this->state).super_LodePNGState.info_png.iccp_profile;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
               (this_01->extended).iccProfile.profile.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,puVar8,
               puVar8 + (this->state).super_LodePNGState.info_png.iccp_profile_size);
    iVar7 = std::__cxx11::string::compare((char *)piVar1);
    if (iVar7 == 0) {
      (this_01->basic).field_0x1 = 4;
      FormatDescriptor::setTransfer(this_01,KHR_DF_TRANSFER_PQ_EOTF);
    }
  }
  if ((((this->state).super_LodePNGState.info_png.chrm_defined != 0) &&
      ((this->state).super_LodePNGState.info_png.srgb_defined == 0)) &&
     ((this->state).super_LodePNGState.info_png.iccp_defined == 0)) {
    auVar10._0_4_ = (this->state).super_LodePNGState.info_png.chrm_red_x;
    auVar10._4_4_ = (this->state).super_LodePNGState.info_png.chrm_red_y;
    auVar10._8_4_ = (this->state).super_LodePNGState.info_png.chrm_green_x;
    auVar10._12_4_ = (this->state).super_LodePNGState.info_png.chrm_green_y;
    auVar13 = auVar10 & _DAT_001fd530 | _DAT_001fd540;
    auVar11._0_4_ = (uint)auVar10._0_4_ >> 0x10;
    auVar11._4_4_ = (uint)auVar10._4_4_ >> 0x10;
    auVar11._8_4_ = (uint)auVar10._8_4_ >> 0x10;
    auVar11._12_4_ = (uint)auVar10._12_4_ >> 0x10;
    auVar11 = auVar11 | _DAT_001fd550;
    auVar12._0_4_ = (auVar11._0_4_ - 5.497642e+11) + auVar13._0_4_;
    auVar12._4_4_ = (auVar11._4_4_ - 5.497642e+11) + auVar13._4_4_;
    auVar12._8_4_ = (auVar11._8_4_ - 5.497642e+11) + auVar13._8_4_;
    auVar12._12_4_ = (auVar11._12_4_ - 5.497642e+11) + auVar13._12_4_;
    local_b8 = divps(auVar12,_DAT_0020d3e0);
    auVar13._0_4_ = (this->state).super_LodePNGState.info_png.chrm_white_x;
    auVar13._4_4_ = (this->state).super_LodePNGState.info_png.chrm_white_y;
    auVar13._8_4_ = (this->state).super_LodePNGState.info_png.chrm_red_x;
    auVar13._12_4_ = (this->state).super_LodePNGState.info_png.chrm_red_y;
    auVar2._0_4_ = (this->state).super_LodePNGState.info_png.chrm_blue_x;
    auVar2._4_4_ = (this->state).super_LodePNGState.info_png.chrm_blue_y;
    auVar2._8_4_ = (this->state).super_LodePNGState.info_png.srgb_defined;
    auVar2._12_4_ = (this->state).super_LodePNGState.info_png.srgb_intent;
    auVar14._0_8_ = auVar2._0_8_;
    auVar14._8_8_ = auVar13._0_8_;
    auVar10 = _DAT_001fd530 & auVar14 | _DAT_001fd540;
    auVar15._0_4_ = (uint)auVar2._0_4_ >> 0x10;
    auVar15._4_4_ = (uint)auVar2._4_4_ >> 0x10;
    auVar15._8_4_ = (uint)auVar13._0_4_ >> 0x10;
    auVar15._12_4_ = (uint)auVar13._4_4_ >> 0x10;
    auVar15 = auVar15 | _DAT_001fd550;
    auVar16._0_4_ = (auVar15._0_4_ - 5.497642e+11) + auVar10._0_4_;
    auVar16._4_4_ = (auVar15._4_4_ - 5.497642e+11) + auVar10._4_4_;
    auVar16._8_4_ = (auVar15._8_4_ - 5.497642e+11) + auVar10._8_4_;
    auVar16._12_4_ = (auVar15._12_4_ - 5.497642e+11) + auVar10._12_4_;
    local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                )divps(auVar16,_DAT_0020d3e0);
    uVar5 = findMapping();
    (this_01->basic).field_0x1 = uVar5;
  }
  return;
}

Assistant:

void
PngInput::readHeader()
{
    // Unfortunately LoadPNG doesn't believe in stdio. The functions
    // we need either read from memory or take a file name. To avoid
    // a potentially unnecessary slurp of the whole file check the
    // signature ourselves.
    uint8_t pngsig[8] = {
       0x89, 0x50, 0x4e, 0x47, 0x0d, 0x0a, 0x1a, 0x0a
    };
    uint8_t filesig[sizeof(pngsig)];
    isp->read((char *)filesig, sizeof(pngsig));
    if (isp->fail())
       throwOnReadFailure();
    if (memcmp(filesig, pngsig, sizeof(pngsig)))
       throw different_format();

    // It's a PNG file.

    isp->seekg(0, isp->beg);
    // Slurp it into memory so we can use lodepng_inspect, to determine
    // the data type, and lodepng_chunk_find.
    //
    // Why no special case for when we've already read the file into a
    // stringstream (i.e. buffer.get() == isp)? Because the only way to access
    // such data is to call stringstream::str() which makes a copy. So treat
    // everything the same. For the same reason we slurp into a vector not
    // a stringstream here.
    slurp();

    unsigned int lodepngError;
    uint32_t w, h;
    lodepngError = lodepng_decode_chunks(&pIdat, &idatsize, &w, &h, &state,
                                         (const uint8_t*)pngBuffer.data(),
                                         pngBuffer.size());
    if (lodepngError) {
        throw std::runtime_error(
            fmt::format("PNG decode chunks error: {}.",
                        lodepng_error_text(lodepngError))
        );
    }

    // Tell the decoder to produce the same color type as the file. Exceptions
    // to this are made later.
    lodepng_color_mode_copy(&state.info_raw, &state.info_png.color);

    uint32_t componentCount = 0;
    uint32_t bitDepth = state.info_png.color.bitdepth;
    // Initialisation here keeps compilers happy in the LCT_MAX_OCTET cases.
    khr_df_model_e colorModel = KHR_DF_MODEL_RGBSDA;

    switch (state.info_png.color.colortype) {
      case LCT_GREY:
        if (state.info_png.color.key_defined) {
            state.info_raw.colortype = LCT_GREY_ALPHA;
            componentCount = 2;
            colorModel = KHR_DF_MODEL_YUVSDA;
        } else {
            componentCount = 1;
            colorModel = KHR_DF_MODEL_YUVSDA;
        }
        break;
      case LCT_RGB:
        if (state.info_png.color.key_defined) {
            state.info_raw.colortype = LCT_RGBA;
            componentCount = 4;
            colorModel = KHR_DF_MODEL_RGBSDA;
        } else {
            componentCount = 3;
            colorModel = KHR_DF_MODEL_RGBSDA;
        }
        break;
      case LCT_PALETTE: {
        // color.key_defined is not set for paletted. tRNS info is written
        // directly into the palette. To determine the colortype to expand to
        // here we need to check if there is a tRNS chunk.
	    const unsigned char *pTrnsChunk = nullptr;
        // 1st chunk after header
        const unsigned char* pFirstChunk = (unsigned char*)&pngBuffer[33];
        pTrnsChunk = lodepng_chunk_find_const(pFirstChunk,
                                (unsigned char*)&pngBuffer[pngBuffer.size()-1],
                                "tRNS");
        if (pTrnsChunk) {
            state.info_raw.colortype = LCT_RGBA;
            componentCount = 4;
            colorModel = KHR_DF_MODEL_RGBSDA;
        } else {
            state.info_raw.colortype = LCT_RGB;
            componentCount = 3;
            colorModel = KHR_DF_MODEL_RGBSDA;
        }
        // There are no paletted texture formats, except an ancient one in
        // OpenGL ES 1 & 2 so, rather than complicate the users of imageio
        // with handling for them, cause them to be expanded to 8 bits by
        // this reader and issue a warning.
        if (state.info_png.color.bitdepth < 8) {
            bitDepth = 8; // This value will be set in the ImageSpec and
                          // eventually passed back to readImage().
        }
        fwarning(fmt::format("Expanding {}-bit paletted image to {}",
                state.info_png.color.bitdepth,
                state.info_raw.colortype == LCT_RGBA ? "R8G8B8A8" : "R8G8B8"));
        }
        break;
      case LCT_GREY_ALPHA:
        componentCount = 2;
        colorModel = KHR_DF_MODEL_YUVSDA;
        break;
      case LCT_RGBA:
        colorModel = KHR_DF_MODEL_RGBSDA;
        componentCount = 4;
        break;
      case LCT_MAX_OCTET_VALUE:
        break;
    }

    ImageInputFormatType formatType;
    switch (state.info_png.color.colortype) {
    case LCT_GREY:
        formatType = ImageInputFormatType::png_l;
        break;
    case LCT_GREY_ALPHA:
        formatType = ImageInputFormatType::png_la;
        break;
    case LCT_RGB:
        formatType = ImageInputFormatType::png_rgb;
        break;
    case LCT_RGBA:
        formatType = ImageInputFormatType::png_rgba;
        break;
    case LCT_PALETTE:
        formatType = ImageInputFormatType::png_rgba;
        break;
    case LCT_MAX_OCTET_VALUE:
        break;
    }

  images.emplace_back(ImageSpec(w, h, 1,
                            ImageSpec::Origin(ImageSpec::Origin::eLeft, ImageSpec::Origin::eTop),
                            componentCount,
                            bitDepth,
                            static_cast<khr_df_sample_datatype_qualifiers_e>(0),
                            KHR_DF_TRANSFER_UNSPECIFIED,
                            // PNG spec. says BT.709 primaries are a
                            // reasonable default.
                            KHR_DF_PRIMARIES_BT709,
                            colorModel),
                        formatType);

    // This is ugly. FIXME:
    FormatDescriptor& format = const_cast<FormatDescriptor&>(spec().format());
    if (state.info_png.iccp_defined) {
        format.setPrimaries(KHR_DF_PRIMARIES_UNSPECIFIED);
        format.setTransfer(KHR_DF_TRANSFER_UNSPECIFIED);
        format.extended.iccProfile.name =  state.info_png.iccp_name;
        format.extended.iccProfile.profile.resize(state.info_png.iccp_profile_size);
        format.extended.iccProfile.profile.insert(
               format.extended.iccProfile.profile.begin(),
               state.info_png.iccp_profile,
               &state.info_png.iccp_profile[state.info_png.iccp_profile_size]);
        if (format.extended.iccProfile.name == "ITUR_2100_PQ_FULL") {
            format.setPrimaries(KHR_DF_PRIMARIES_BT2020);
            format.setTransfer(KHR_DF_TRANSFER_PQ_EOTF);
        }
    } else if (state.info_png.srgb_defined) {
        // srgb_intent is a guide for the user/application when applying
        // a color transform during rendering, especially when
        // gamut mapping. It does not affect the meaning or value
        // of the image pixels so there is nothing to do here.
        format.setTransfer(KHR_DF_TRANSFER_SRGB);
        format.setPrimaries(KHR_DF_PRIMARIES_SRGB);
    } else if (state.info_png.gama_defined) {
        format.setTransfer(KHR_DF_TRANSFER_UNSPECIFIED);
        // The value in the gAMA chunk is the exponent of the power curve
        // used for encoding the image, i.e. the OETF, * 100000.
        format.extended.oeGamma = (float)state.info_png.gama_gamma / 100000;
    } else {
        format.setTransfer(KHR_DF_TRANSFER_UNSPECIFIED);
    }

    if (state.info_png.chrm_defined
        && !state.info_png.srgb_defined && !state.info_png.iccp_defined) {
        Primaries primaries;
        primaries.Rx = (float)state.info_png.chrm_red_x / 100000;
        primaries.Ry = (float)state.info_png.chrm_red_y / 100000;
        primaries.Gx = (float)state.info_png.chrm_green_x / 100000;
        primaries.Gy = (float)state.info_png.chrm_green_y / 100000;
        primaries.Bx = (float)state.info_png.chrm_blue_x / 100000;
        primaries.By = (float)state.info_png.chrm_blue_y / 100000;
        primaries.Wx = (float)state.info_png.chrm_white_x / 100000;
        primaries.Wy = (float)state.info_png.chrm_white_y / 100000;
        format.setPrimaries(findMapping(&primaries, 0.002f));
    }
}